

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O2

Vec_Int_t * Gia_ManInsertOrder(Gia_Man_t *p,Vec_Int_t *vObjs,Vec_Wec_t *vFuncs)

{
  int iObj;
  Vec_Int_t *vNodes;
  Gia_Obj_t *pObj;
  int v;
  
  vNodes = Vec_IntAlloc(p->nObjs);
  v = 0;
  while( true ) {
    if (p->vCos->nSize <= v) {
      return vNodes;
    }
    pObj = Gia_ManCo(p,v);
    iObj = Gia_ObjId(p,pObj);
    if (iObj == 0) break;
    Gia_ManInsertOrder_rec(p,iObj,vObjs,vFuncs,vNodes);
    v = v + 1;
  }
  return vNodes;
}

Assistant:

Vec_Int_t * Gia_ManInsertOrder( Gia_Man_t * p, Vec_Int_t * vObjs, Vec_Wec_t * vFuncs )
{
    int i, Id;
    Vec_Int_t * vNodes = Vec_IntAlloc( Gia_ManObjNum(p) );
    Gia_ManForEachCoId( p, Id, i )
        Gia_ManInsertOrder_rec( p, Id, vObjs, vFuncs, vNodes );
    return vNodes;
}